

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::jsonpath::detail::
jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
::advance_past_space_character
          (jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
           *this)

{
  byte bVar1;
  byte *pbVar2;
  
  pbVar2 = (byte *)this->p_;
  bVar1 = *pbVar2;
  if (bVar1 < 0xd) {
    if (bVar1 == 9) {
LAB_004321fb:
      this->p_ = (char_type *)(pbVar2 + 1);
      this->column_ = this->column_ + 1;
      return;
    }
    if (bVar1 != 10) {
      return;
    }
  }
  else {
    if (bVar1 != 0xd) {
      if (bVar1 != 0x20) {
        return;
      }
      goto LAB_004321fb;
    }
    if ((pbVar2 + 1 < this->end_input_) && (pbVar2[1] == 10)) {
      pbVar2 = pbVar2 + 1;
    }
  }
  this->line_ = this->line_ + 1;
  this->column_ = 1;
  this->p_ = (char_type *)(pbVar2 + 1);
  return;
}

Assistant:

void advance_past_space_character()
        {
            switch (*p_)
            {
                case ' ':case '\t':
                    ++p_;
                    ++column_;
                    break;
                case '\r':
                    if (p_+1 < end_input_ && *(p_+1) == '\n')
                    {
                        ++p_;
                    }
                    ++line_;
                    column_ = 1;
                    ++p_;
                    break;
                case '\n':
                    ++line_;
                    column_ = 1;
                    ++p_;
                    break;
                default:
                    break;
            }
        }